

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9VmPushFilePath(jx9_vm *pVm,char *zPath,int nLen,sxu8 bMain,sxi32 *pNew)

{
  void *pvVar1;
  char *pcVar2;
  int iVar3;
  sxi32 sVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  SyString sPath;
  char *local_40;
  sxu32 local_38;
  
  if (nLen < 0) {
    pcVar6 = zPath;
    if (*zPath != '\0') {
      pcVar2 = zPath + 2;
      do {
        pcVar6 = pcVar2;
        if (pcVar6[-1] == '\0') {
          pcVar6 = pcVar6 + -1;
          goto LAB_00123741;
        }
        if (*pcVar6 == '\0') goto LAB_00123741;
        if (pcVar6[1] == '\0') {
          pcVar6 = pcVar6 + 1;
          goto LAB_00123741;
        }
        pcVar2 = pcVar6 + 4;
      } while (pcVar6[2] != '\0');
      pcVar6 = pcVar6 + 2;
    }
LAB_00123741:
    nLen = (int)pcVar6 - (int)zPath;
  }
  pcVar6 = SyMemBackendStrDup(&pVm->sAllocator,zPath,nLen);
  if (pcVar6 != (char *)0x0) {
    local_40 = pcVar6;
    local_38 = nLen;
    if (bMain == '\0') {
      uVar7 = (ulong)(pVm->aIncluded).nUsed;
      if (uVar7 != 0) {
        pvVar1 = (pVm->aIncluded).pBase;
        lVar8 = 0;
        do {
          iVar3 = nLen - *(int *)((long)pvVar1 + lVar8 + 8);
          if (iVar3 == 0) {
            iVar3 = SyMemcmp(pcVar6,*(void **)((long)pvVar1 + lVar8),nLen);
          }
          if (iVar3 == 0) {
            sVar4 = 0;
            goto LAB_001237f2;
          }
          lVar8 = lVar8 + 0x10;
        } while (uVar7 << 4 != lVar8);
      }
      sVar4 = SySetPut(&pVm->aIncluded,&local_40);
      if (sVar4 != 0) {
        sVar4 = SyMemBackendFree(&pVm->sAllocator,pcVar6);
        return sVar4;
      }
      sVar4 = 1;
LAB_001237f2:
      *pNew = sVar4;
    }
    uVar5 = SySetPut(&pVm->aFiles,&local_40);
    pcVar6 = (char *)(ulong)uVar5;
  }
  return (sxi32)pcVar6;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmPushFilePath(jx9_vm *pVm, const char *zPath, int nLen, sxu8 bMain, sxi32 *pNew)
{
	SyString sPath;
	char *zDup;
#ifdef __WINNT__
	char *zCur;
#endif
	sxi32 rc;
	if( nLen < 0 ){
		nLen = SyStrlen(zPath);
	}
	/* Duplicate the file path first */
	zDup = SyMemBackendStrDup(&pVm->sAllocator, zPath, nLen);
	if( zDup == 0 ){
		return SXERR_MEM;
	}
#ifdef __WINNT__
	/* Normalize path on windows
	 * Example:
	 *    Path/To/File.jx9
	 * becomes
	 *   path\to\file.jx9
	 */
	zCur = zDup;
	while( zCur[0] != 0 ){
		if( zCur[0] == '/' ){
			zCur[0] = '\\';
		}else if( (unsigned char)zCur[0] < 0xc0 && SyisUpper(zCur[0]) ){
			int c = SyToLower(zCur[0]);
			zCur[0] = (char)c; /* MSVC stupidity */
		}
		zCur++;
	}
#endif
	/* Install the file path */
	SyStringInitFromBuf(&sPath, zDup, nLen);
	if( !bMain ){
		if( VmIsIncludedFile(&(*pVm), &sPath) ){
			/* Already included */
			*pNew = 0;
		}else{
			/* Insert in the corresponding container */
			rc = SySetPut(&pVm->aIncluded, (const void *)&sPath);
			if( rc != SXRET_OK ){
				SyMemBackendFree(&pVm->sAllocator, zDup);
				return rc;
			}
			*pNew = 1;
		}
	}
	SySetPut(&pVm->aFiles, (const void *)&sPath);
	return SXRET_OK;
}